

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindDegenerates.cpp
# Opt level: O0

bool __thiscall
Assimp::FindDegeneratesProcess::ExecuteOnMesh(FindDegeneratesProcess *this,aiMesh *mesh)

{
  bool bVar1;
  uint *puVar2;
  Logger *pLVar3;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_00;
  basic_formatter *this_01;
  uint uVar4;
  reference rVar5;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_f8;
  undefined4 local_d4;
  undefined4 *local_d0;
  aiFace *face_dest;
  _Bit_type local_c0;
  undefined4 *local_b8;
  aiFace *face_src;
  uint a_1;
  uint n;
  _Bit_type local_a0;
  ai_real local_94;
  undefined1 auStack_90 [4];
  ai_real area;
  _Bit_type local_88;
  uint local_7c;
  uint local_78;
  uint m;
  uint t;
  byte local_69;
  uint i;
  bool first;
  aiFace *face;
  uint a;
  uint limit;
  uint deg;
  undefined1 local_48 [8];
  vector<bool,_std::allocator<bool>_> remove_me;
  aiMesh *mesh_local;
  FindDegeneratesProcess *this_local;
  
  mesh->mPrimitiveTypes = 0;
  remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)mesh;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_48);
  if ((this->mConfigRemoveDegenerates & 1U) != 0) {
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)local_48,
               (ulong)(uint)remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage[1],false);
  }
  a = 0;
  for (face._0_4_ = 0;
      (uint)face <
      (uint)remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage[1]; face._0_4_ = (uint)face + 1) {
    _i = (aiFace *)
         (remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage[0x1a] + (ulong)(uint)face * 0x10);
    local_69 = 1;
    for (t = 0; t < _i->mNumIndices; t = t + 1) {
      face._4_4_ = _i->mNumIndices;
      uVar4 = t;
      if (4 < _i->mNumIndices) {
        m = t + 2;
        puVar2 = std::min<unsigned_int>((uint *)((long)&face + 4),&m);
        face._4_4_ = *puVar2;
        uVar4 = t;
      }
      while (local_78 = uVar4 + 1, local_78 < face._4_4_) {
        bVar1 = aiVector3t<float>::operator==
                          ((aiVector3t<float> *)
                           (remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage[2] +
                           (ulong)_i->mIndices[t] * 0xc),
                           (aiVector3t<float> *)
                           (remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage[2] +
                           (ulong)_i->mIndices[local_78] * 0xc));
        uVar4 = local_78;
        if (bVar1) {
          _i->mNumIndices = _i->mNumIndices - 1;
          face._4_4_ = face._4_4_ - 1;
          for (local_7c = local_78; local_7c < _i->mNumIndices; local_7c = local_7c + 1) {
            _i->mIndices[local_7c] = _i->mIndices[local_7c + 1];
          }
          local_78 = local_78 - 1;
          _i->mIndices[_i->mNumIndices] = 0xdeadbeef;
          if ((local_69 & 1) != 0) {
            a = a + 1;
            local_69 = 0;
          }
          uVar4 = local_78;
          if ((this->mConfigRemoveDegenerates & 1U) != 0) {
            rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)(uint)face);
            _auStack_90 = rVar5;
            std::_Bit_reference::operator=((_Bit_reference *)auStack_90,true);
            goto LAB_0018a5c9;
          }
        }
      }
      if (((this->mConfigCheckAreaOfTriangle & 1U) != 0) && (_i->mNumIndices == 3)) {
        local_94 = calculateAreaOfTriangle
                             (_i,(aiMesh *)
                                 remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_end_of_storage);
        if ((local_94 < 1e-06) && ((this->mConfigRemoveDegenerates & 1U) != 0)) {
          rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)(uint)face);
          _a_1 = rVar5;
          std::_Bit_reference::operator=((_Bit_reference *)&a_1,true);
          a = a + 1;
          goto LAB_0018a5c9;
        }
      }
    }
    uVar4 = _i->mNumIndices;
    if (uVar4 == 1) {
      *(uint *)remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_end_of_storage =
           (uint)*remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage | 1;
    }
    else if (uVar4 == 2) {
      *(uint *)remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_end_of_storage =
           (uint)*remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage | 2;
    }
    else if (uVar4 == 3) {
      *(uint *)remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_end_of_storage =
           (uint)*remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage | 4;
    }
    else {
      *(uint *)remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_end_of_storage =
           (uint)*remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage | 8;
    }
LAB_0018a5c9:
  }
  if (((this->mConfigRemoveDegenerates & 1U) != 0) && (a != 0)) {
    face_src._4_4_ = 0;
    for (face_src._0_4_ = 0;
        (uint)face_src <
        (uint)remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage[1]; face_src._0_4_ = (uint)face_src + 1) {
      local_b8 = (undefined4 *)
                 (remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage[0x1a] + (ulong)(uint)face_src * 0x10);
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)(uint)face_src);
      local_c0 = rVar5._M_mask;
      face_dest = (aiFace *)rVar5._M_p;
      bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&face_dest);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        if (*(void **)(local_b8 + 2) != (void *)0x0) {
          operator_delete__(*(void **)(local_b8 + 2));
        }
        *(undefined8 *)(local_b8 + 2) = 0;
        *local_b8 = 0;
      }
      else {
        uVar4 = face_src._4_4_ + 1;
        local_d0 = (undefined4 *)
                   (remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage[0x1a] + (ulong)face_src._4_4_ * 0x10)
        ;
        *local_d0 = *local_b8;
        *(undefined8 *)(local_d0 + 2) = *(undefined8 *)(local_b8 + 2);
        face_src._4_4_ = uVar4;
        if (local_b8 != local_d0) {
          *local_b8 = 0;
          *(undefined8 *)(local_b8 + 2) = 0;
        }
      }
    }
    *(uint *)(remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage + 1) = face_src._4_4_;
    if ((int)remove_me.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage[1] == 0) {
      pLVar3 = DefaultLogger::get();
      Logger::debug(pLVar3,"FindDegeneratesProcess removed a mesh full of degenerated primitives");
      this_local._7_1_ = true;
      goto LAB_0018a8ba;
    }
  }
  if (a != 0) {
    bVar1 = DefaultLogger::isNullLogger();
    if (!bVar1) {
      pLVar3 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[7]>(&local_270,(char (*) [7])0x2bf6b0);
      this_00 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_270,&a);
      this_01 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(this_00,(char (*) [24])0x2bf53f);
      Formatter::basic_formatter::operator_cast_to_string(&local_f8,this_01);
      Logger::warn(pLVar3,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_270);
    }
  }
  this_local._7_1_ = false;
LAB_0018a8ba:
  local_d4 = 1;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_48)
  ;
  return this_local._7_1_;
}

Assistant:

bool FindDegeneratesProcess::ExecuteOnMesh( aiMesh* mesh) {
    mesh->mPrimitiveTypes = 0;

    std::vector<bool> remove_me;
    if (mConfigRemoveDegenerates) {
        remove_me.resize( mesh->mNumFaces, false );
    }

    unsigned int deg = 0, limit;
    for ( unsigned int a = 0; a < mesh->mNumFaces; ++a ) {
        aiFace& face = mesh->mFaces[a];
        bool first = true;

        // check whether the face contains degenerated entries
        for (unsigned int i = 0; i < face.mNumIndices; ++i) {
            // Polygons with more than 4 points are allowed to have double points, that is
            // simulating polygons with holes just with concave polygons. However,
            // double points may not come directly after another.
            limit = face.mNumIndices;
            if (face.mNumIndices > 4) {
                limit = std::min( limit, i+2 );
            }

            for (unsigned int t = i+1; t < limit; ++t) {
                if (mesh->mVertices[face.mIndices[ i ] ] == mesh->mVertices[ face.mIndices[ t ] ]) {
                    // we have found a matching vertex position
                    // remove the corresponding index from the array
                    --face.mNumIndices;
                    --limit;
                    for (unsigned int m = t; m < face.mNumIndices; ++m) {
                        face.mIndices[ m ] = face.mIndices[ m+1 ];
                    }
                    --t;

                    // NOTE: we set the removed vertex index to an unique value
                    // to make sure the developer gets notified when his
                    // application attempts to access this data.
                    face.mIndices[ face.mNumIndices ] = 0xdeadbeef;

                    if(first) {
                        ++deg;
                        first = false;
                    }

                    if ( mConfigRemoveDegenerates ) {
                        remove_me[ a ] = true;
                        goto evil_jump_outside; // hrhrhrh ... yeah, this rocks baby!
                    }
                }
            }

            if ( mConfigCheckAreaOfTriangle ) {
                if ( face.mNumIndices == 3 ) {
                    ai_real area = calculateAreaOfTriangle( face, mesh );
                    if ( area < 1e-6 ) {
                        if ( mConfigRemoveDegenerates ) {
                            remove_me[ a ] = true;
                            ++deg;
                            goto evil_jump_outside;
                        }

                        // todo: check for index which is corrupt.
                    }
                }
            }
        }

        // We need to update the primitive flags array of the mesh.
        switch (face.mNumIndices)
        {
        case 1u:
            mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
            break;
        case 2u:
            mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
            break;
        case 3u:
            mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
            break;
        default:
            mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
            break;
        };
evil_jump_outside:
        continue;
    }

    // If AI_CONFIG_PP_FD_REMOVE is true, remove degenerated faces from the import
    if (mConfigRemoveDegenerates && deg) {
        unsigned int n = 0;
        for (unsigned int a = 0; a < mesh->mNumFaces; ++a)
        {
            aiFace& face_src = mesh->mFaces[a];
            if (!remove_me[a]) {
                aiFace& face_dest = mesh->mFaces[n++];

                // Do a manual copy, keep the index array
                face_dest.mNumIndices = face_src.mNumIndices;
                face_dest.mIndices    = face_src.mIndices;

                if (&face_src != &face_dest) {
                    // clear source
                    face_src.mNumIndices = 0;
                    face_src.mIndices = nullptr;
                }
            }
            else {
                // Otherwise delete it if we don't need this face
                delete[] face_src.mIndices;
                face_src.mIndices = nullptr;
                face_src.mNumIndices = 0;
            }
        }
        // Just leave the rest of the array unreferenced, we don't care for now
        mesh->mNumFaces = n;
        if (!mesh->mNumFaces) {
            //The whole mesh consists of degenerated faces
            //signal upward, that this mesh should be deleted.
            ASSIMP_LOG_DEBUG("FindDegeneratesProcess removed a mesh full of degenerated primitives");
            return true;
        }
    }

    if (deg && !DefaultLogger::isNullLogger()) {
        ASSIMP_LOG_WARN_F( "Found ", deg, " degenerated primitives");
    }
    return false;
}